

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

void huge_repeat_cb(uv_timer_t *handle)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (huge_repeat_cb::ncalls == 0) {
    if (handle != &huge_timer1) {
      pcVar2 = "handle == &huge_timer1";
      uVar1 = 0xf9;
      goto LAB_0016af7c;
    }
    huge_repeat_cb::ncalls = 1;
  }
  else {
    if (handle != &tiny_timer) {
      pcVar2 = "handle == &tiny_timer";
      uVar1 = 0xfb;
LAB_0016af7c:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-timer.c"
              ,uVar1,pcVar2);
      abort();
    }
    huge_repeat_cb::ncalls = huge_repeat_cb::ncalls + 1;
    if (huge_repeat_cb::ncalls == 10) {
      uv_close(&tiny_timer,0);
      uv_close(&huge_timer1,0);
      return;
    }
  }
  return;
}

Assistant:

static void huge_repeat_cb(uv_timer_t* handle) {
  static int ncalls;

  if (ncalls == 0)
    ASSERT(handle == &huge_timer1);
  else
    ASSERT(handle == &tiny_timer);

  if (++ncalls == 10) {
    uv_close((uv_handle_t*) &tiny_timer, NULL);
    uv_close((uv_handle_t*) &huge_timer1, NULL);
  }
}